

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>
               (OpCode op,OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  uint uVar7;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar4 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar4 < 0x11f) {
    if (iVar4 - 0xd6U < 3) {
      this = ParseableFunctionInfo::GetNestedFunctionProxy
                       (&dumpFunction->super_ParseableFunctionInfo,data->SlotIndex);
      uVar7 = data->Value;
      pPVar5 = FunctionProxy::EnsureDeserialized(this);
      iVar4 = (*(pPVar5->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(pPVar5);
      Output::Print(L" R%d = %s()",(ulong)uVar7,CONCAT44(extraout_var,iVar4));
      return;
    }
    if (iVar4 == 0x92) {
LAB_007f84d1:
      uVar1 = data->SlotIndex;
      uVar7 = data->Value;
      form = L" R%d = [%d] ";
      goto LAB_007f84dd;
    }
    if (iVar4 != 0x96) goto LAB_007f84fe;
  }
  else {
    uVar7 = iVar4 - 0x11f;
    if (0x2d < uVar7) {
LAB_007f84fe:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x395,"(false)","Unknown OpCode for OpLayoutElementSlotI1");
      if (bVar3) {
        *puVar6 = 0;
        return;
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if ((0x3cc800000000U >> ((ulong)uVar7 & 0x3f) & 1) == 0) {
      if ((0x28200003UL >> ((ulong)uVar7 & 0x3f) & 1) == 0) goto LAB_007f84fe;
      goto LAB_007f84d1;
    }
  }
  uVar7 = data->SlotIndex;
  uVar1 = data->Value;
  form = L" [%d] = R%d ";
LAB_007f84dd:
  Output::Print(form,(ulong)uVar7,(ulong)uVar1);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlotI1(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StLocalSlot:
            case OpCode::StParamSlot:
            case OpCode::StLocalObjSlot:
            case OpCode::StParamObjSlot:
            case OpCode::StLocalSlotChkUndecl:
            case OpCode::StParamSlotChkUndecl:
            case OpCode::StLocalObjSlotChkUndecl:
            case OpCode::StParamObjSlotChkUndecl:
                Output::Print(_u(" [%d] = R%d "),data->SlotIndex, data->Value);
                break;
            case OpCode::LdLocalSlot:
            case OpCode::LdParamSlot:
            case OpCode::LdEnvObj:
            case OpCode::LdEnvObj_ReuseLoc:
            case OpCode::LdLocalObjSlot:
            case OpCode::LdParamObjSlot:
                Output::Print(_u(" R%d = [%d] "), data->Value, data->SlotIndex);
                break;
            case OpCode::NewScFunc:
            case OpCode::NewStackScFunc:
            case OpCode::NewScGenFunc:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = %s()"), data->Value,
                        pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI1");
                break;
            }
        }
    }